

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

void update_z(OSQPWorkspace *work)

{
  OSQPWorkspace *in_RDI;
  c_int i;
  long local_10;
  
  for (local_10 = 0; local_10 < in_RDI->data->m; local_10 = local_10 + 1) {
    in_RDI->z[local_10] =
         in_RDI->rho_inv_vec[local_10] * in_RDI->y[local_10] +
         in_RDI->settings->alpha * in_RDI->xz_tilde[local_10 + in_RDI->data->n] +
         (1.0 - in_RDI->settings->alpha) * in_RDI->z_prev[local_10];
  }
  project(in_RDI,in_RDI->z);
  return;
}

Assistant:

void update_z(OSQPWorkspace *work) {
  c_int i;

  // update z
  for (i = 0; i < work->data->m; i++) {
    work->z[i] = work->settings->alpha * work->xz_tilde[i + work->data->n] +
                 ((c_float)1.0 - work->settings->alpha) * work->z_prev[i] +
                 work->rho_inv_vec[i] * work->y[i];
  }

  // project z
  project(work, work->z);
}